

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<6,_11,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  Vector<float,_2> *pVVar2;
  undefined4 *puVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  undefined4 uVar8;
  float afStack_88 [4];
  Vector<float,_3> res_1;
  float fStack_6c;
  float local_68 [5];
  float local_54 [3];
  undefined8 uStack_48;
  Type in0;
  Matrix<float,_4,_2> res;
  
  puVar1 = &uStack_48;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        uVar8 = 0x3f800000;
        if (lVar4 != lVar5) {
          uVar8 = 0;
        }
        *(undefined4 *)(puVar1 + lVar5) = uVar8;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      bVar7 = lVar4 == 0;
      lVar4 = lVar4 + 1;
    } while (bVar7);
    uStack_48 = *(undefined8 *)evalCtx->in[0].m_data;
    in0.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    in0.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[2].m_data;
    in0.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[3].m_data;
  }
  else {
    in0.m_data.m_data[1].m_data[0] = 0.0;
    in0.m_data.m_data[1].m_data[1] = 0.0;
    in0.m_data.m_data[2].m_data[0] = 0.0;
    in0.m_data.m_data[2].m_data[1] = 0.0;
    uStack_48 = 0;
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    puVar3 = &s_constInMat4x2;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        *(undefined4 *)(puVar1 + lVar5) = puVar3[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar3 = puVar3 + 4;
      bVar7 = lVar4 == 0;
      lVar4 = lVar4 + 1;
    } while (bVar7);
  }
  pVVar2 = in0.m_data.m_data + 3;
  in0.m_data.m_data[3].m_data[0] = 0.0;
  in0.m_data.m_data[3].m_data[1] = 0.0;
  lVar4 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar4 != lVar6) {
        uVar8 = 0;
      }
      *(undefined4 *)((long)pVVar2->m_data + lVar6) = uVar8;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 == 0x10);
    lVar5 = lVar5 + 1;
    pVVar2 = (Vector<float,_2> *)(pVVar2->m_data + 1);
    lVar4 = lVar4 + 0x10;
  } while (lVar5 != 4);
  pVVar2 = in0.m_data.m_data + 3;
  puVar1 = &uStack_48;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      pVVar2->m_data[lVar5] = *(float *)(puVar1 + lVar5);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    pVVar2 = pVVar2 + 2;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    bVar7 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar7);
  res_1.m_data[2] = in0.m_data.m_data[3].m_data[0];
  fStack_6c = in0.m_data.m_data[3].m_data[1];
  local_54[0] = 0.0;
  local_54[1] = 0.0;
  local_54[2] = 0.0;
  afStack_88[2] = 0.0;
  afStack_88[3] = 0.0;
  res_1.m_data[0] = 0.0;
  lVar4 = 0;
  do {
    res_1.m_data[lVar4 + -2] = res_1.m_data[lVar4 + 2] + local_54[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  stack0xffffffffffffff90 = &evalCtx->color;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[(int)res_1.m_data[lVar4 + 2]] = afStack_88[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(transpose(in0));
	}